

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParallelSuite.cpp
# Opt level: O0

bool __thiscall
Test::ParallelSuite::run
          (ParallelSuite *this,Output *out,
          vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> *selectedMethods,
          bool continueOnError)

{
  bool bVar1;
  uint uVar2;
  SynchronizedOutput *this_00;
  size_type sVar3;
  char *fileName;
  ulong uVar4;
  reference this_01;
  reference this_02;
  future<bool> *result;
  iterator __end1;
  iterator __begin1;
  vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *__range1;
  ParallelSuite *local_148;
  undefined8 local_140;
  future<bool> local_138;
  undefined1 local_128 [8];
  uint i;
  vector<std::future<bool>,_std::allocator<std::future<bool>_>_> results;
  undefined1 local_100 [8];
  Assertion notEmptyAssterion;
  bool continueOnError_local;
  vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> *selectedMethods_local;
  Output *out_local;
  ParallelSuite *this_local;
  
  (this->super_Suite).continueAfterFail = continueOnError;
  this_00 = (SynchronizedOutput *)operator_new(0x38);
  SynchronizedOutput::SynchronizedOutput(this_00,out);
  (this->super_Suite).output = (Output *)this_00;
  sVar3 = std::vector<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>::size
                    (&(this->super_Suite).testMethods);
  (*out->_vptr_Output[2])(out,&(this->super_Suite).suiteName,sVar3 & 0xffffffff);
  uVar2 = (*(this->super_Suite)._vptr_Suite[5])();
  if ((uVar2 & 1) != 0) {
    bVar1 = std::vector<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>::empty
                      (&(this->super_Suite).testMethods);
    if (!bVar1) {
      fileName = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str(&(this->super_Suite).suiteName);
      Assertion::Assertion
                ((Assertion *)local_100,fileName,0,
                 "Any test-methods directly added to a parallel-suite are not executed!");
      (*out->_vptr_Output[8])(out,(Assertion *)local_100);
      Assertion::~Assertion((Assertion *)local_100);
    }
    (*(this->super_Suite)._vptr_Suite[6])();
  }
  sVar3 = std::vector<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>::size
                    (&(this->super_Suite).testMethods);
  results.super__Vector_base<std::future<bool>,_std::allocator<std::future<bool>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::zero();
  (*out->_vptr_Output[3])
            (out,&(this->super_Suite).suiteName,sVar3 & 0xffffffff,0,
             results.super__Vector_base<std::future<bool>,_std::allocator<std::future<bool>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar3 = std::vector<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>
          ::size(&(this->super_Suite).subSuites);
  std::allocator<std::future<bool>_>::allocator((allocator<std::future<bool>_> *)(local_128 + 7));
  std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::vector
            ((vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)&i,sVar3,
             (allocator<std::future<bool>_> *)(local_128 + 7));
  std::allocator<std::future<bool>_>::~allocator((allocator<std::future<bool>_> *)(local_128 + 7));
  for (local_128._0_4_ = 0; uVar4 = (ulong)(uint)local_128._0_4_,
      sVar3 = std::
              vector<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>::
              size(&(this->super_Suite).subSuites), uVar4 < sVar3;
      local_128._0_4_ = local_128._0_4_ + 1) {
    local_148 = (ParallelSuite *)runSuite;
    local_140 = 0;
    __range1 = (vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)this;
    std::
    async<bool(Test::ParallelSuite::*)(unsigned_int,std::vector<Test::TestMethodInfo,std::allocator<Test::TestMethodInfo>>const&),Test::ParallelSuite*,unsigned_int&,std::vector<Test::TestMethodInfo,std::allocator<Test::TestMethodInfo>>const&>
              ((launch)&local_138,(type *)0x1,&local_148,(uint *)&__range1,
               (vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> *)local_128);
    this_01 = std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::operator[]
                        ((vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)&i,
                         (ulong)(uint)local_128._0_4_);
    std::future<bool>::operator=(this_01,&local_138);
    std::future<bool>::~future(&local_138);
  }
  __end1 = std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::begin
                     ((vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)&i);
  result = (future<bool> *)
           std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::end
                     ((vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)&i);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::future<bool>_*,_std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>_>
                                     *)&result), bVar1) {
    this_02 = __gnu_cxx::
              __normal_iterator<std::future<bool>_*,_std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>_>
              ::operator*(&__end1);
    std::future<bool>::get(this_02);
    __gnu_cxx::
    __normal_iterator<std::future<bool>_*,_std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::~vector
            ((vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)&i);
  return true;
}

Assistant:

bool ParallelSuite::run(Output &out, const std::vector<TestMethodInfo> &selectedMethods, bool continueOnError) {
  this->continueAfterFail = continueOnError;
  this->output = new SynchronizedOutput(out);
  out.initializeSuite(suiteName, static_cast<unsigned>(testMethods.size()));
  if (setup()) {
    // warn if test-methods are directly added
    if (!testMethods.empty()) {
      Assertion notEmptyAssterion(
          suiteName.c_str(), 0, "Any test-methods directly added to a parallel-suite are not executed!");
      out.printFailure(notEmptyAssterion);
    }
    // run tear-down after all tests
    tear_down();
  }
  out.finishSuite(suiteName, static_cast<unsigned>(testMethods.size()), 0, std::chrono::microseconds::zero());

  std::vector<std::future<bool>> results(subSuites.size());
  // run sub-suites
  for (unsigned int i = 0; i < subSuites.size(); i++) {
    results[i] = std::async(std::launch::async, &ParallelSuite::runSuite, this, i, selectedMethods);
  }

  // join sub-suites
  for (std::future<bool> &result : results) {
    result.get();
  }

  return true;
}